

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack19_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar15 = *(undefined1 (*) [32])(in + 1);
  auVar9 = vpmovsxbd_avx512f(_DAT_00197870);
  uVar7 = *in;
  uVar1 = *(ulong *)(in + 9);
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  uVar3 = *(ulong *)(in + 0x10);
  uVar2 = in[0x12];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar17 = vpsllvd_avx2(auVar16,_DAT_00197810);
  auVar5 = vpsllvd_avx2(auVar15,_DAT_001944a0);
  auVar16 = vpalignr_avx(auVar16,*(undefined1 (*) [16])(in + 5),0xc);
  auVar5 = vpand_avx2(auVar5,_DAT_001944c0);
  auVar16 = vpsrlvd_avx2(auVar16,_DAT_00197800);
  *out = uVar7 & 0x7ffff;
  auVar9 = vpermi2d_avx512f(auVar9,ZEXT3264(auVar15),ZEXT464(uVar7));
  auVar11 = vpmovsxbd_avx512f(_DAT_00197880);
  auVar12 = vpbroadcastd_avx512f(ZEXT416(0x7ffff));
  auVar9 = vpermi2q_avx512f(auVar10,auVar9,ZEXT1664(auVar17));
  auVar10 = vpmovsxbd_avx512f(_DAT_00197890);
  auVar11 = vpermd_avx512f(auVar11,auVar9);
  auVar11 = vpsrlvd_avx512f(auVar11,_DAT_001a97c0);
  auVar10 = vpermi2d_avx512f(auVar10,ZEXT3264(auVar5),ZEXT1664(auVar16));
  auVar13 = vmovdqa64_avx512f(auVar11);
  auVar9 = vpandd_avx512f(auVar9,_DAT_001a9800);
  auVar13._56_4_ = auVar9._56_4_;
  auVar13._60_4_ = auVar9._60_4_;
  uVar7 = in[0xf];
  auVar9 = vpord_avx512f(auVar13,auVar10);
  auVar10 = vpandd_avx512f(auVar11,auVar12);
  auVar11._4_4_ = auVar10._4_4_;
  auVar11._0_4_ = auVar9._0_4_;
  auVar11._8_4_ = auVar9._8_4_;
  auVar11._12_4_ = auVar10._12_4_;
  auVar11._16_4_ = auVar9._16_4_;
  auVar11._20_4_ = auVar9._20_4_;
  auVar11._24_4_ = auVar10._24_4_;
  auVar11._28_4_ = auVar9._28_4_;
  auVar11._32_4_ = auVar10._32_4_;
  auVar11._36_4_ = auVar9._36_4_;
  auVar11._40_4_ = auVar9._40_4_;
  auVar11._44_4_ = auVar10._44_4_;
  auVar11._48_4_ = auVar9._48_4_;
  auVar11._52_4_ = auVar10._52_4_;
  auVar11._56_4_ = auVar9._56_4_;
  auVar11._60_4_ = auVar9._60_4_;
  auVar16 = *(undefined1 (*) [16])(in + 0xb);
  auVar9 = vmovdqu64_avx512f(auVar11);
  *(undefined1 (*) [64])(out + 1) = auVar9;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17 = vshufps_avx(auVar17,auVar16,5);
  auVar4 = vshufps_avx(auVar16,auVar16,0xe9);
  auVar15._16_16_ = auVar4;
  auVar15._0_16_ = auVar17;
  auVar17 = vshufps_avx(auVar16,auVar16,0x72);
  auVar4 = vpsllvd_avx2(auVar17,_DAT_00197820);
  auVar6 = vpsrlvd_avx2(auVar15,_DAT_001944e0);
  auVar17 = vshufps_avx(auVar16,auVar16,0xff);
  auVar16 = vpand_avx(auVar4,_DAT_00197830);
  auVar17 = vpinsrd_avx(auVar17,uVar7,1);
  auVar15 = vpand_avx2(auVar6,auVar12._0_32_);
  auVar5 = vpermq_avx2(ZEXT1632(auVar16),0x44);
  auVar5 = vpor_avx2(auVar6,auVar5);
  auVar15 = vpblendd_avx2(auVar15,auVar5,0x5a);
  *(undefined1 (*) [32])(out + 0x11) = auVar15;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar16 = vpsllvd_avx2(auVar14,_DAT_00197840);
  auVar4._8_8_ = 0x7f00000040000;
  auVar4._0_8_ = 0x7f00000040000;
  auVar8 = vpandq_avx512vl(auVar16,auVar4);
  auVar16 = vshufps_avx(auVar17,auVar14,4);
  auVar4 = vpsrlvd_avx2(auVar16,_DAT_00197860);
  auVar16 = vpinsrd_avx(auVar12._0_16_,(uVar7 & 0x3fff) << 5,0);
  uVar7 = (uint)(uVar3 >> 0x20);
  auVar17 = vpunpckldq_avx(auVar16,auVar8);
  auVar16 = vpand_avx(auVar4,auVar12._0_16_);
  auVar17 = vpor_avx(auVar4,auVar17);
  auVar16 = vpblendd_avx2(auVar17,auVar16,4);
  *(undefined1 (*) [16])(out + 0x19) = auVar16;
  out[0x1d] = uVar7 >> 7 & 0x7ffff;
  out[0x1e] = uVar7 >> 0x1a | (uVar2 & 0x1fff) << 6;
  out[0x1f] = uVar2 >> 0xd;
  return in + 0x13;
}

Assistant:

const uint32_t *__fastunpack19_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 11)) << (19 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 19);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 17)) << (19 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 4)) << (19 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 19);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 10)) << (19 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 19);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 16)) << (19 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 3)) << (19 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 19);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 9)) << (19 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 19);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 15)) << (19 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 2)) << (19 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 19);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 8)) << (19 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 19);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 14)) << (19 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 1)) << (19 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 19);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 7)) << (19 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 19);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 13)) << (19 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  out++;

  return in;
}